

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall
cfdcapi_psbt_UsecaseMultisig_Test::~cfdcapi_psbt_UsecaseMultisig_Test
          (cfdcapi_psbt_UsecaseMultisig_Test *this)

{
  void *in_RDI;
  
  ~cfdcapi_psbt_UsecaseMultisig_Test((cfdcapi_psbt_UsecaseMultisig_Test *)0x3a1e58);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(cfdcapi_psbt, UsecaseMultisig) {
  // const char* psbt_utxo_sh_wsh_multi = "02000000000102f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0100000017160014c1768dd714526732f54de6c8581a78e385d0900affffffffc6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e4001000000171600141305fd9c86bb2cd2d671928388eccd2b1140aa5affffffff010858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587024730440220032350deae8e8fc60a45800508b09f475ba6043b40ce87f8020a6cc532e401ab02205979d8ad394e19ef9881bb987f77dab465f1112a746ca17a509215c2dbfea93201210206d743464ae738be5ba6d07dd434bed3f24af32f9fad805ffb9a241ec56ea24802473044022051f8776ba287c7424b2d783ebde964e25bde5fec4728735b8b455c806daae16602207988cabc3475109e264a7d378873d0fcee78959c46facdafb099af4ca6eace94012103e241f36e5e17a599c465ec82f3520e6d7a0506cc862de06ff4ba26b255a2f62c00000000";

  auto path1 = "44h/0h/0h/0/12";
  auto key1 = "02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b";
  auto key2 = "02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242";
  auto out_multisig = "522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae";
  // auto addr = "tb1q8jksvxw7vlnzg7nk5ypgzd34cpf52lrt5n77ftqllkq534cwf0xqjsj24p";

  auto in_path = "44h/0h/0h/0/11";
  auto key_in1 = "ac9aa506601b23ea7362dfcb9350ff3c2edeb67b334258d6489889e67dfa417f";
  auto pubkey_in1 = "03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3";
  auto key_in2 = "973e1d45dca188b0c0ac67bcc5de3ccdbe479d7505bdc43c57231c75f8db55e3";
  auto pubkey_in2 = "03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47";
  auto multisig = "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae";

  const char* txid = "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69";
  uint32_t vout = 0;

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, "", "", 2, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    // psbt_utxo_sh_wsh_multi
    ret = CfdAddPsbtTxInWithScript(handle, psbt_handle,
        txid, vout,
        0xffffffff, 499996680,
        "a914945fb50391a70637c1ffc5ab7fb65308c2f2317587",
        multisig, "", "");
    EXPECT_EQ(kCfdSuccess, ret);
    CfdcapiPsbtDumpLog(ret, handle);

    ret = CfdSetPsbtSighashType(handle, psbt_handle,
        txid, vout,
        1);
    EXPECT_EQ(kCfdSuccess, ret);
    CfdcapiPsbtDumpLog(ret, handle);

    ret = CfdGetPsbtData(handle, psbt_handle, &output, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    char* psbt1 = nullptr;
    char* psbt2 = nullptr;
    char* base64 = nullptr;
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBAwQBAAAAAQQiACCcTayyXruK2ou7Gt24ad6k2BcMyVHx2WlLIVThWDJ2yQEFR1IhA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzIQP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R1KuAA==", output);

      void* psbt_handle1 = nullptr;
      ret = CfdCreatePsbtHandle(
        handle, net_type, output, "", 0, 0, &psbt_handle1);
      EXPECT_EQ(kCfdSuccess, ret);
      CfdcapiPsbtDumpLog(ret, handle);
      if (ret == kCfdSuccess) {
        ret = CfdSetPsbtTxInBip32Pubkey(handle, psbt_handle1,
            txid, vout,
            pubkey_in1, "2a704760", in_path);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdGetPsbtData(handle, psbt_handle1, &psbt1, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdFreePsbtHandle(handle, psbt_handle1);
        EXPECT_EQ(kCfdSuccess, ret);
      }

      void* psbt_handle2 = nullptr;
      ret = CfdCreatePsbtHandle(
        handle, net_type, output, "", 0, 0, &psbt_handle2);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdSetPsbtTxInBip32Pubkey(handle, psbt_handle2,
            txid, vout,
            pubkey_in2, "9d6b6d86", in_path);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdGetPsbtData(handle, psbt_handle2, &psbt2, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdFreePsbtHandle(handle, psbt_handle2);
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdFreeStringBuffer(output);
      EXPECT_EQ(kCfdSuccess, ret);
      output = nullptr;
    }

    ret = CfdAddPsbtTxOutWithScript(handle, psbt_handle, 499993360,
        "00203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc",
        out_multisig, "", nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetPsbtTxOutBip32Pubkey(handle, psbt_handle, 0,
        key1, "2a704760", path1);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetPsbtTxOutBip32Pubkey(handle, psbt_handle, 0,
        key2, "9d6b6d86", path1);
    EXPECT_EQ(kCfdSuccess, ret);

    if ((psbt1 != nullptr) && (psbt2 != nullptr)) {
      ret = CfdJoinPsbt(handle, psbt_handle, psbt1);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdJoinPsbt(handle, psbt_handle, psbt2);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdGetPsbtData(handle, psbt_handle, &base64, &output);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", output);
        EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=", base64);

        ret = CfdFreeStringBuffer(output);
        EXPECT_EQ(kCfdSuccess, ret);
        output = nullptr;
        ret = CfdFreeStringBuffer(base64);
        EXPECT_EQ(kCfdSuccess, ret);
        base64 = nullptr;
      }
    }
    if (psbt1 != nullptr) {
      ret = CfdFreeStringBuffer(psbt1);
      EXPECT_EQ(kCfdSuccess, ret);
      psbt1 = nullptr;
    }
    if (psbt2 != nullptr) {
      ret = CfdFreeStringBuffer(psbt2);
      EXPECT_EQ(kCfdSuccess, ret);
      psbt2 = nullptr;
    }

    ret = CfdGetPsbtData(handle, psbt_handle, &output, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      // sign psbt
      void* psbt_handle1 = nullptr;
      ret = CfdCreatePsbtHandle(
        handle, net_type, output, "", 0, 0, &psbt_handle1);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdSignPsbt(handle, psbt_handle1, key_in1, true);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdGetPsbtData(handle, psbt_handle1, &psbt1, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdFreePsbtHandle(handle, psbt_handle1);
        EXPECT_EQ(kCfdSuccess, ret);
      }

      void* psbt_handle2 = nullptr;
      ret = CfdCreatePsbtHandle(
        handle, net_type, output, "", 0, 0, &psbt_handle2);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        // ret = CfdSignPsbt(handle, psbt_handle2, key_in2, true);
        // EXPECT_EQ(kCfdSuccess, ret);
        // CfdcapiPsbtDumpLog(ret, handle);
        // Same processing.
        int sighash_type = 0;
        ret = CfdGetPsbtSighashType(handle, psbt_handle2, txid, vout, &sighash_type);
        EXPECT_EQ(kCfdSuccess, ret);
        EXPECT_EQ(1, sighash_type);

        int64_t amount = 0;
        char* script = nullptr;
        char* tx = nullptr;
        ret = CfdGetPsbtUtxoData(handle, psbt_handle2, txid, vout, &amount, nullptr, &script, nullptr, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdcapiPsbtDumpLog(ret, handle);
        if (ret == kCfdSuccess) {
          ret = CfdGetPsbtGlobalData(handle, psbt_handle2, nullptr, &tx, nullptr, nullptr);
          EXPECT_EQ(kCfdSuccess, ret);
          if (ret == kCfdSuccess) {
            char* sighash = nullptr;
            ret = CfdCreateSighash(handle, net_type, tx, txid, vout, kCfdP2shP2wsh,
                pubkey_in2, script, amount, sighash_type, false, &sighash);
            EXPECT_EQ(kCfdSuccess, ret);
            if (ret == kCfdSuccess) {
              char* sig = nullptr;
              ret = CfdCalculateEcSignature(handle, sighash, key_in2, nullptr, net_type, true, &sig);
              EXPECT_EQ(kCfdSuccess, ret);
              if (ret == kCfdSuccess) {
                char* der_sig = nullptr;
                ret = CfdEncodeSignatureByDer(handle, sig, sighash_type, false, &der_sig);
                EXPECT_EQ(kCfdSuccess, ret);
                if (ret == kCfdSuccess) {
                  ret = CfdSetPsbtSignature(handle, psbt_handle2, txid, vout, pubkey_in2, der_sig);
                  EXPECT_EQ(kCfdSuccess, ret);

                  ret = CfdFreeStringBuffer(der_sig);
                  EXPECT_EQ(kCfdSuccess, ret);
                  der_sig = nullptr;
                }
                ret = CfdFreeStringBuffer(sig);
                EXPECT_EQ(kCfdSuccess, ret);
                sig = nullptr;
              }
              ret = CfdFreeStringBuffer(sighash);
              EXPECT_EQ(kCfdSuccess, ret);
              sighash = nullptr;
            }
            ret = CfdFreeStringBuffer(tx);
            EXPECT_EQ(kCfdSuccess, ret);
            tx = nullptr;
          }
          ret = CfdFreeStringBuffer(script);
          EXPECT_EQ(kCfdSuccess, ret);
          script = nullptr;
        }

        ret = CfdGetPsbtData(handle, psbt_handle2, &psbt2, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);

        ret = CfdFreePsbtHandle(handle, psbt_handle2);
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdFreeStringBuffer(output);
      EXPECT_EQ(kCfdSuccess, ret);
      output = nullptr;
    }

    if ((psbt1 != nullptr) && (psbt2 != nullptr)) {
      ret = CfdCombinePsbt(handle, psbt_handle, psbt1);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdCombinePsbt(handle, psbt_handle, psbt2);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdGetPsbtData(handle, psbt_handle, &base64, &output);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", output);
        EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA", base64);

        ret = CfdFreeStringBuffer(output);
        EXPECT_EQ(kCfdSuccess, ret);
        output = nullptr;
        ret = CfdFreeStringBuffer(base64);
        EXPECT_EQ(kCfdSuccess, ret);
        base64 = nullptr;
      }
    }
    if (psbt1 != nullptr) {
      ret = CfdFreeStringBuffer(psbt1);
      EXPECT_EQ(kCfdSuccess, ret);
      psbt1 = nullptr;
    }
    if (psbt2 != nullptr) {
      ret = CfdFreeStringBuffer(psbt2);
      EXPECT_EQ(kCfdSuccess, ret);
      psbt2 = nullptr;
    }

    ret = CfdIsFinalizedPsbt(handle, psbt_handle);
    EXPECT_EQ(kCfdSignVerificationError, ret);

    ret = CfdSetPsbtFinalizeScript(handle, psbt_handle,
        txid, vout,
        "00473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae");
    EXPECT_EQ(kCfdSuccess, ret);
    CfdcapiPsbtDumpLog(ret, handle);

    ret = CfdIsFinalizedPsbt(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    CfdcapiPsbtDumpLog(ret, handle);

    ret = CfdClearPsbtSignData(handle, psbt_handle,
        txid, vout);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdExtractPsbtTransaction(handle, psbt_handle, &output);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000", output);
      ret = CfdFreeStringBuffer(output);
      EXPECT_EQ(kCfdSuccess, ret);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}